

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionEntryPointInfo::OnCleanup(FunctionEntryPointInfo *this,bool isShutdown)

{
  Type *pp_Var1;
  JavascriptMethod p_Var2;
  code *pcVar3;
  State SVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  FunctionEntryPointInfo *pFVar8;
  JavascriptMethod p_Var9;
  FunctionProxy *this_00;
  
  SVar4 = EntryPointInfo::GetState(&this->super_EntryPointInfo);
  if (SVar4 == CodeGenDone) {
    this_00 = (this->functionProxy).ptr;
    if ((((this_00->functionInfo).ptr)->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x23f1,"(this->functionProxy->GetFunctionInfo()->HasBody())",
                                  "this->functionProxy->GetFunctionInfo()->HasBody()");
      if (!bVar5) goto LAB_00773c2d;
      *puVar7 = 0;
      this_00 = (this->functionProxy).ptr;
    }
    bVar5 = FunctionProxy::IsFunctionBody(this_00);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar5) {
LAB_00773c2d:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    if (((this->super_EntryPointInfo).field_0x18 & 0x20) != 0) {
      iVar6 = (*(this->super_EntryPointInfo).super_ProxyEntryPointInfo.super_ExpirableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0xb])(this);
      FunctionBody::ReleaseLoopHeaders((FunctionBody *)CONCAT44(extraout_var,iVar6));
    }
    pFVar8 = (FunctionEntryPointInfo *)FunctionProxy::GetAuxPtr(this_00,SimpleJitEntryPointInfo);
    if (pFVar8 == this) {
      FunctionProxy::SetAuxPtr(this_00,SimpleJitEntryPointInfo,(void *)0x0);
    }
    p_Var2 = (JavascriptMethod)(this->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod;
    p_Var9 = EntryPointInfo::GetNativeEntrypoint(&this->super_EntryPointInfo);
    if (p_Var2 == p_Var9) {
      pp_Var1 = &(this->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod;
      *(byte *)pp_Var1 = *(byte *)pp_Var1 | 1;
    }
  }
  (this->functionProxy).ptr = (FunctionProxy *)0x0;
  return;
}

Assistant:

void FunctionEntryPointInfo::OnCleanup(bool isShutdown)
    {
        if (this->IsCodeGenDone())
        {
            Assert(this->functionProxy->GetFunctionInfo()->HasBody());

#if ENABLE_NATIVE_CODEGEN
            if (this->IsNativeEntryPointProcessed())
            {
                JS_ETW(EtwTrace::LogMethodNativeUnloadEvent(this->functionProxy->GetFunctionBody(), this));
            }
#endif

            FunctionBody* functionBody = this->functionProxy->GetFunctionBody();
#ifdef ASMJS_PLAT
            if (this->GetIsTJMode())
            {
                // release LoopHeaders here if the entrypointInfo is TJ
                this->GetFunctionBody()->ReleaseLoopHeaders();
            }
#endif
            if(functionBody->GetSimpleJitEntryPointInfo() == this)
            {
                functionBody->SetSimpleJitEntryPointInfo(nullptr);
            }
#if ENABLE_NATIVE_CODEGEN
            CleanupNativeCode(this->functionProxy->GetScriptContext());
#endif
        }

        this->functionProxy = nullptr;
    }